

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftRigidDynamicsWorld.cpp
# Opt level: O1

void btSoftRigidDynamicsWorld::rayTestSingle
               (btTransform *rayFromTrans,btTransform *rayToTrans,btCollisionObject *collisionObject
               ,btCollisionShape *collisionShape,btTransform *colObjWorldTransform,
               RayResultCallback *resultCallback)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  float fVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  LocalShapeInfo shapeInfo;
  sRayCast softResult;
  undefined4 local_88;
  int local_84;
  sRayCast local_80;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  btCollisionObject *local_48;
  undefined1 *local_40;
  float local_38;
  float fStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  float local_28;
  
  if (collisionShape->m_shapeType == 0x20) {
    if ((collisionObject != (btCollisionObject *)0x0) && (collisionObject->m_internalType == 8)) {
      bVar3 = btSoftBody::rayTest((btSoftBody *)collisionObject,&rayFromTrans->m_origin,
                                  &rayToTrans->m_origin,&local_80);
      if ((bVar3) && (local_80.fraction <= resultCallback->m_closestHitFraction)) {
        local_88 = 0;
        local_84 = local_80.index;
        fVar6 = (rayToTrans->m_origin).m_floats[2] - (rayFromTrans->m_origin).m_floats[2];
        uVar1 = *(undefined8 *)(rayToTrans->m_origin).m_floats;
        uVar2 = *(undefined8 *)(rayFromTrans->m_origin).m_floats;
        fVar7 = (float)uVar1 - (float)uVar2;
        fVar8 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
        fVar4 = fVar6 * fVar6 + fVar7 * fVar7 + fVar8 * fVar8;
        if (fVar4 < 0.0) {
          local_58 = ZEXT416((uint)fVar6);
          local_68 = CONCAT44(fVar8,fVar7);
          uStack_60 = 0;
          fVar4 = sqrtf(fVar4);
          fVar6 = (float)local_58._0_4_;
          fVar7 = (float)local_68;
          fVar8 = local_68._4_4_;
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        if (local_80.feature == Face) {
          uVar1 = *(undefined8 *)
                   (*(long *)&collisionObject[2].m_checkCollideWith + 0x28 +
                   (long)local_80.index * 0x48);
          local_38 = (float)uVar1;
          fStack_34 = (float)((ulong)uVar1 >> 0x20);
          uVar5 = *(ulong *)(*(long *)&collisionObject[2].m_checkCollideWith + 0x30 +
                            (long)local_80.index * 0x48);
          if (0.0 < fVar6 * (float)uVar5 + fVar7 * local_38 + fVar8 * fStack_34) {
            local_38 = -local_38;
            fStack_34 = -fStack_34;
            uVar5 = (ulong)(uint)-(float)uVar5;
          }
        }
        else {
          fVar4 = 1.0 / fVar4;
          local_38 = fVar4 * -fVar7;
          fStack_34 = fVar4 * -fVar8;
          uVar5 = (ulong)(uint)(fVar4 * -fVar6);
        }
        uStack_30 = (undefined4)uVar5;
        uStack_2c = (undefined4)(uVar5 >> 0x20);
        local_28 = local_80.fraction;
        local_48 = collisionObject;
        local_40 = (undefined1 *)&local_88;
        (*resultCallback->_vptr_RayResultCallback[3])(resultCallback,&local_48,1);
      }
    }
    return;
  }
  btCollisionWorld::rayTestSingle
            (rayFromTrans,rayToTrans,collisionObject,collisionShape,colObjWorldTransform,
             resultCallback);
  return;
}

Assistant:

void	btSoftRigidDynamicsWorld::rayTestSingle(const btTransform& rayFromTrans,const btTransform& rayToTrans,
					  btCollisionObject* collisionObject,
					  const btCollisionShape* collisionShape,
					  const btTransform& colObjWorldTransform,
					  RayResultCallback& resultCallback)
{
	if (collisionShape->isSoftBody()) {
		btSoftBody* softBody = btSoftBody::upcast(collisionObject);
		if (softBody) {
			btSoftBody::sRayCast softResult;
			if (softBody->rayTest(rayFromTrans.getOrigin(), rayToTrans.getOrigin(), softResult)) 
			{
				
				if (softResult.fraction<= resultCallback.m_closestHitFraction)
				{

					btCollisionWorld::LocalShapeInfo shapeInfo;
					shapeInfo.m_shapePart = 0;
					shapeInfo.m_triangleIndex = softResult.index;
					// get the normal
					btVector3 rayDir = rayToTrans.getOrigin() - rayFromTrans.getOrigin();
					btVector3 normal=-rayDir;
					normal.normalize();

					if (softResult.feature == btSoftBody::eFeature::Face)
					{
						normal = softBody->m_faces[softResult.index].m_normal;
						if (normal.dot(rayDir) > 0) {
							// normal always point toward origin of the ray
							normal = -normal;
						}
					}
	
					btCollisionWorld::LocalRayResult rayResult
						(collisionObject,
						 &shapeInfo,
						 normal,
						 softResult.fraction);
					bool	normalInWorldSpace = true;
					resultCallback.addSingleResult(rayResult,normalInWorldSpace);
				}
			}
		}
	} 
	else {
		btCollisionWorld::rayTestSingle(rayFromTrans,rayToTrans,collisionObject,collisionShape,colObjWorldTransform,resultCallback);
	}
}